

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

FileTypeEnum
cmsys::SystemTools::DetectFileType(char *filename,unsigned_long length,double percent_bin)

{
  byte bVar1;
  FILE *__stream;
  void *__ptr;
  size_t sVar2;
  size_t sVar3;
  FileTypeEnum FVar4;
  FileTypeEnum FVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  allocator local_49;
  double local_48;
  char *local_40 [4];
  
  FVar4 = FileTypeUnknown;
  FVar5 = FileTypeUnknown;
  if ((filename != (char *)0x0) && (FVar5 = FVar4, 0.0 <= percent_bin)) {
    local_48 = percent_bin;
    std::__cxx11::string::string((string *)local_40,filename,&local_49);
    __stream = fopen64(local_40[0],"rb");
    std::__cxx11::string::~string((string *)local_40);
    if (__stream != (FILE *)0x0) {
      __ptr = operator_new__(length);
      sVar2 = fread(__ptr,1,length,__stream);
      fclose(__stream);
      if (sVar2 != 0) {
        lVar6 = 0;
        for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
          bVar1 = *(byte *)((long)__ptr + sVar3);
          if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)))) {
            lVar6 = lVar6 + 1;
          }
        }
        operator_delete__(__ptr);
        lVar6 = sVar2 - lVar6;
        auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar8._0_8_ = lVar6;
        auVar8._12_4_ = 0x45300000;
        auVar7._8_4_ = (int)(sVar2 >> 0x20);
        auVar7._0_8_ = sVar2;
        auVar7._12_4_ = 0x45300000;
        FVar5 = (((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) < local_48) +
                FileTypeBinary;
      }
    }
  }
  return FVar5;
}

Assistant:

SystemTools::FileTypeEnum
SystemTools::DetectFileType(const char *filename,
                            unsigned long length,
                            double percent_bin)
{
  if (!filename || percent_bin < 0)
    {
    return SystemTools::FileTypeUnknown;
    }

  FILE *fp = Fopen(filename, "rb");
  if (!fp)
    {
    return SystemTools::FileTypeUnknown;
    }

  // Allocate buffer and read bytes

  unsigned char *buffer = new unsigned char [length];
  size_t read_length = fread(buffer, 1, length, fp);
  fclose(fp);
  if (read_length == 0)
    {
    return SystemTools::FileTypeUnknown;
    }

  // Loop over contents and count

  size_t text_count = 0;

  const unsigned char *ptr = buffer;
  const unsigned char *buffer_end = buffer + read_length;

  while (ptr != buffer_end)
    {
    if ((*ptr >= 0x20 && *ptr <= 0x7F) ||
        *ptr == '\n' ||
        *ptr == '\r' ||
        *ptr == '\t')
      {
      text_count++;
      }
    ptr++;
    }

  delete [] buffer;

  double current_percent_bin =
    (static_cast<double>(read_length - text_count) /
     static_cast<double>(read_length));

  if (current_percent_bin >= percent_bin)
    {
    return SystemTools::FileTypeBinary;
    }

  return SystemTools::FileTypeText;
}